

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MatchResultListener * __thiscall
testing::MatchResultListener::operator<<(MatchResultListener *this,char (*x) [19])

{
  char *in_RSI;
  MatchResultListener *in_RDI;
  
  if (in_RDI->stream_ != (ostream *)0x0) {
    std::operator<<(in_RDI->stream_,in_RSI);
  }
  return in_RDI;
}

Assistant:

MatchResultListener& operator<<(const T& x) {
    if (stream_ != NULL)
      *stream_ << x;
    return *this;
  }